

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint Extra_TruthCanonN(uint uTruth,int nVars)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int Polarity;
  uint uVar4;
  
  bVar1 = (byte)nVars & 0x1f;
  Polarity = 0;
  iVar3 = 1 << bVar1;
  if (1 << bVar1 < 1) {
    iVar3 = 0;
  }
  uVar4 = 0xffffffff;
  for (; iVar3 != Polarity; Polarity = Polarity + 1) {
    uVar2 = Extra_TruthPolarize(uTruth,Polarity,nVars);
    if (uVar2 <= uVar4) {
      uVar4 = uVar2;
    }
  }
  return uVar4;
}

Assistant:

unsigned Extra_TruthCanonN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}